

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NotOperand.hpp
# Opt level: O2

string * __thiscall
ut11::detail::NotOperand<ut11::Operands::IsStringBeginningWith>::GetErrorMessage<char[6]>
          (string *__return_storage_ptr__,NotOperand<ut11::Operands::IsStringBeginningWith> *this,
          char (*actual) [6])

{
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,"Expected Not failed: \n",(allocator *)&local_58);
  std::__cxx11::string::string((string *)&local_38,*actual,&local_59);
  Operands::IsStringBeginningWith::GetErrorMessage(&local_58,&this->operand,&local_38);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetErrorMessage(const T& actual) const
			{
				std::string errorMessage("Expected Not failed: \n");
				errorMessage += operand.GetErrorMessage(actual);
				return errorMessage;
			}